

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O3

void drawnumber_vis(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,
                   t_float basey,int vis)

{
  uint uVar1;
  int iVar2;
  int zoom;
  undefined4 extraout_var;
  _glist *p_Var3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  float fVar7;
  t_float tVar8;
  t_float tVar9;
  t_float tVar10;
  char *tags [2];
  char tag [80];
  t_atom fontatoms [3];
  char buf [1024];
  
  tags[0] = tag;
  tags[1] = "label";
  if (vis == 0) {
    iVar2 = sprintf(tag,"drawnumber%lx",data);
    p_Var3 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar2));
    pdgui_vmess((char *)0x0,"crs",p_Var3,"delete",tag);
  }
  else if (*(char *)&z[0xb].g_pd == '\x01') {
    if (*(char *)((long)&z[0xb].g_pd + 1) == '\0') {
      fVar7 = *(float *)&z[0xb].g_next;
    }
    else {
      fVar7 = template_getfloat(template,(t_symbol *)z[0xb].g_next,data,0);
    }
    if ((fVar7 != 0.0) || (NAN(fVar7))) {
      sprintf(tag,"drawnumber%lx",data);
      tVar8 = fielddesc_getcoord((_fielddesc *)&z[3].g_next,template,data,0);
      tVar8 = glist_xtopixels(glist,tVar8 + basex);
      tVar9 = fielddesc_getcoord((_fielddesc *)(z + 6),template,data,0);
      tVar9 = glist_ytopixels(glist,tVar9 + basey);
      tVar10 = fielddesc_getfloat((_fielddesc *)&z[8].g_next,template,data,1);
      uVar6 = (ulong)(uint)(int)tVar10;
      if ((int)tVar10 < 1) {
        uVar6 = 0;
      }
      uVar5 = (uint)(uVar6 * 0x66666667 >> 0x20);
      uVar1 = (uint)(uVar6 * 0x51eb851f >> 0x20) & 0x3fffffe0;
      if (0xfe < uVar1) {
        uVar1 = 0xff;
      }
      uVar4 = ((uVar5 >> 2) + (int)((uVar6 * 0x66666667) / 0x2800000000) * -10) * 0x20;
      if (0xfe < uVar4) {
        uVar4 = 0xff;
      }
      uVar5 = ((int)uVar6 + ((uVar5 >> 2) + (uVar5 >> 2)) * -5) * 0x20;
      if (0xfe < uVar5) {
        uVar5 = 0xff;
      }
      drawnumber_getbuf((t_drawnumber *)z,data,template,buf);
      fontatoms[0].a_type = A_SYMBOL;
      fontatoms[0].a_w.w_symbol = gensym(sys_font);
      fontatoms[1].a_type = A_FLOAT;
      iVar2 = glist_getfont(glist);
      zoom = glist_getzoom(glist);
      iVar2 = sys_hostfontsize(iVar2,zoom);
      fontatoms[1].a_w._0_4_ = (undefined4)-iVar2;
      fontatoms[2].a_type = A_SYMBOL;
      fontatoms[2].a_w.w_symbol = gensym(sys_fontweight);
      p_Var3 = glist_getcanvas((_glist *)fontatoms[2].a_w.w_symbol);
      pdgui_vmess((char *)0x0,"crr ii rs rk rs rA rS",p_Var3,"create","text",(ulong)(uint)(int)tVar8
                  ,(ulong)(uint)(int)tVar9,"-anchor","nw","-fill",
                  (ulong)(uVar5 | uVar1 << 0x10 | uVar4 << 8),"-text",buf,"-font",3,fontatoms,
                  "-tags",2,tags);
    }
  }
  return;
}

Assistant:

static void drawnumber_vis(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int vis)
{
    t_drawnumber *x = (t_drawnumber *)z;
    char tag[80];
    const char*tags[] = {tag, "label"};

        /* see comment in plot_vis() */
    if (vis && !fielddesc_getfloat(&x->x_vis, template, data, 0))
        return;
    sprintf(tag, "drawnumber%lx", data);
    if (vis)
    {
        t_atom fontatoms[3];
        t_atom at;
        int xloc = glist_xtopixels(glist,
            basex + fielddesc_getcoord(&x->x_xloc, template, data, 0));
        int yloc = glist_ytopixels(glist,
            basey + fielddesc_getcoord(&x->x_yloc, template, data, 0));
        char buf[DRAWNUMBER_BUFSIZE];
        int color = numbertocolor(
            fielddesc_getfloat(&x->x_color, template, data, 1));
        drawnumber_getbuf(x, data, template, buf);

        SETSYMBOL(fontatoms+0, gensym(sys_font));
        SETFLOAT (fontatoms+1,-sys_hostfontsize(glist_getfont(glist), glist_getzoom(glist)));
        SETSYMBOL(fontatoms+2, gensym(sys_fontweight));
        pdgui_vmess(0, "crr ii rs rk rs rA rS",
            glist_getcanvas(glist), "create", "text",
            xloc, yloc,
            "-anchor", "nw",
            "-fill", color,
            "-text", buf,
            "-font", 3, fontatoms,
            "-tags", 2, tags);
    }
    else
        pdgui_vmess(0, "crs", glist_getcanvas(glist), "delete", tag);
}